

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-app.cpp
# Opt level: O0

void __thiscall
StateRecording::updateWorker(StateRecording *this,string *dataOutput,float tElapsed_s)

{
  long lVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t0;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar5;
  stWaveformView<short> sVar6;
  bool in_stack_000000d7;
  int in_stack_000000d8;
  int in_stack_000000dc;
  double in_stack_000000e0;
  undefined4 in_stack_000000e8;
  float in_stack_000000ec;
  float in_stack_000000f0;
  float in_stack_000000f4;
  TKeyPressCollectionT<short> *in_stack_000000f8;
  undefined4 in_stack_00000100;
  EAudioFilter in_stack_00000104;
  TWaveformF *in_stack_00000108;
  int idx;
  float cpm;
  lock_guard<std::mutex> lock_1;
  TWaveformI16 waveformThreshold;
  TWaveformI16 waveformMax;
  TWaveformF waveformFFiltered;
  time_point tEnd;
  time_point tStart;
  int freqCutoffCur_Hz;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar7;
  float in_stack_fffffffffffffe3c;
  undefined1 __i;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int iVar8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  float local_1a4;
  undefined4 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  TWaveformT<float> *in_stack_fffffffffffffe70;
  vector<float,_std::allocator<float>_> *__x;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  string local_160 [32];
  string local_140 [24];
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffed8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee8;
  EAudioFilter in_stack_fffffffffffffeec;
  TWaveformT<float> *in_stack_fffffffffffffef0;
  string local_100 [32];
  string local_e0 [32];
  float local_c0;
  float local_bc;
  int local_b8;
  float local_b4;
  stWaveformView<short> local_a8;
  vector<float,_std::allocator<float>_> local_68;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  uint local_30;
  float local_14;
  string *local_10;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
             ,(mutex_type *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::vector<float,_std::allocator<float>_>::operator=
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x176b65);
  local_30 = *(int *)(in_RDI + 0xc);
  if ((0.0 <= local_14) || (local_30 != 0)) {
    local_30 = 100;
  }
  else {
    local_38 = std::chrono::_V2::system_clock::now();
    fVar5 = Cipher::findBestCutoffFreq
                      (in_stack_00000108,in_stack_00000104,(int64_t)in_stack_000000f8,
                       in_stack_000000f4,in_stack_000000f0,in_stack_000000ec);
    local_30 = (uint)fVar5;
    local_50 = std::chrono::_V2::system_clock::now();
    local_48 = local_38;
    t0.__d.__r._4_4_ = in_stack_fffffffffffffe54;
    t0.__d.__r._0_4_ = in_stack_fffffffffffffe50;
    in_stack_fffffffffffffe94 = local_30;
    local_40 = local_50;
    fVar5 = toSeconds<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      (t0,in_stack_fffffffffffffe48);
    printf("[+] Found best freqCutoff = %d Hz, took %4.3f seconds\n",(double)fVar5,
           (ulong)in_stack_fffffffffffffe94);
  }
  __x = &local_68;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),__x);
  filter<float>(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                (int64_t)in_stack_fffffffffffffee0);
  bVar2 = convert<float,short>
                    (in_stack_fffffffffffffe70,
                     (TWaveformT<short> *)
                     CONCAT17(in_stack_fffffffffffffe6f,
                              CONCAT16(in_stack_fffffffffffffe6e,
                                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                                      )));
  if (!bVar2) {
    printf("Conversion failed\n");
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x176d2b);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x176d38);
  sVar6 = getView<short>((TWaveformT<short> *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  uVar7 = 1;
  local_a8 = sVar6;
  bVar2 = findKeyPresses<short>
                    ((TWaveformViewT<short> *)CONCAT44(in_stack_00000104,in_stack_00000100),
                     in_stack_000000f8,
                     (TWaveformT<short> *)CONCAT44(in_stack_000000f4,in_stack_000000f0),
                     (TWaveformT<short> *)CONCAT44(in_stack_000000ec,in_stack_000000e8),
                     in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d7);
  if (!bVar2) {
    printf("Failed to detect keypresses\n");
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
             ,(mutex_type *)CONCAT44(in_stack_fffffffffffffe3c,uVar7));
  local_b4 = 0.0;
  sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     (in_RDI + 0xb8));
  if (sVar3 != 0) {
    local_b8 = 0;
    while( true ) {
      iVar8 = local_b8;
      sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                        ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                         (in_RDI + 0xb8));
      bVar2 = false;
      if (iVar8 < (int)sVar3) {
        pvVar4 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[]((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                             *)(in_RDI + 0xb8),(long)local_b8);
        lVar1 = pvVar4->pos;
        sVar3 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x70));
        bVar2 = lVar1 < (long)(int)sVar3 + -160000;
      }
      iVar8 = (int)((ulong)__x >> 0x20);
      if (!bVar2) break;
      local_b8 = local_b8 + 1;
    }
    in_stack_fffffffffffffe54 = (float)(*(int *)(in_RDI + 0x14) - local_b8) * 60.0;
    local_bc = 10.0;
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x70));
    local_1a4 = (float)sVar3;
    local_c0 = local_1a4 / 16000.0;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::min<float>(&local_bc,&local_c0);
    local_b4 = in_stack_fffffffffffffe54 / *(float *)__lhs;
    std::__cxx11::to_string(iVar8);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::__cxx11::to_string(in_stack_fffffffffffffe3c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   sVar6.samples,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar6.n);
    std::__cxx11::string::operator=(local_10,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::__cxx11::string::~string(local_140);
  }
  __i = (undefined1)((uint)in_stack_fffffffffffffe3c >> 0x18);
  iVar8 = *(int *)(in_RDI + 0x14);
  sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                    ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                     (in_RDI + 0xb8));
  if (iVar8 < (int)sVar3) {
    sVar3 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                      ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)
                       (in_RDI + 0xb8));
    *(int *)(in_RDI + 0x14) = (int)sVar3;
    printf("    Detected %d keys. %d left. Average typing speed: %5.2f cpm\n",(double)local_b4,
           (ulong)*(uint *)(in_RDI + 0x14),
           (ulong)(*(int *)(in_RDI + 0x10) - *(uint *)(in_RDI + 0x14)));
  }
  if (120.0 < local_14) {
    printf("[!] Recording limit reached\n");
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(iVar8,in_stack_fffffffffffffe40),(bool)__i);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1771ce);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  return;
}

Assistant:

void updateWorker(std::string & dataOutput, float tElapsed_s) {
        {
            std::lock_guard lock(mutex);
            waveformFWork = waveformF;
        }
        {
            auto freqCutoffCur_Hz = freqCutoff_Hz;

            if (tElapsed_s < 0.0f && freqCutoffCur_Hz == 0) {
                const auto tStart = std::chrono::high_resolution_clock::now();

                freqCutoffCur_Hz = Cipher::findBestCutoffFreq(waveformFWork, EAudioFilter::FirstOrderHighPass, kSampleRate, 100.0f, 1000.0f, 100.0f);

                const auto tEnd = std::chrono::high_resolution_clock::now();
                printf("[+] Found best freqCutoff = %d Hz, took %4.3f seconds\n", freqCutoffCur_Hz, toSeconds(tStart, tEnd));
            } else {
                freqCutoffCur_Hz = kFreqCutoff_Hz;
            }

            // apply default filtering, because keypress detection without it is impossible
            auto waveformFFiltered = waveformFWork;
            ::filter(waveformFFiltered, EAudioFilter::FirstOrderHighPass, freqCutoffCur_Hz, kSampleRate);

            if (convert(waveformFFiltered, waveformI16) == false) {
                printf("Conversion failed\n");
            }
        }

        TWaveformI16 waveformMax;
        TWaveformI16 waveformThreshold;
        if (findKeyPresses(getView(waveformI16, 0), keyPresses, waveformThreshold, waveformMax,
                           kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
            printf("Failed to detect keypresses\n");
        }

        {
            std::lock_guard lock(mutex);

            float cpm = 0.0f;
            if (keyPresses.size() > 0) {
                int idx = 0;
                while (idx < (int) keyPresses.size() && keyPresses[idx].pos < ((int) waveformF.size() - 10*kSampleRate)) {
                    ++idx;
                }
                cpm = 60.0f*(nKeysHave - idx)/std::min(10.0f, (float) waveformF.size()/kSampleRate);
                dataOutput = "recording " + std::to_string(nKeysHave) + " " + std::to_string(cpm);
            }

            if (nKeysHave < (int) keyPresses.size()) {
                nKeysHave = keyPresses.size();

                printf("    Detected %d keys. %d left. Average typing speed: %5.2f cpm\n", nKeysHave, nKeysToCapture - nKeysHave, cpm);
            }

            if (tElapsed_s > 2*60.0f) {
                printf("[!] Recording limit reached\n");
                doneRecording = true;
            }
        }
    }